

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less::operator()
          (void *this,char (*t) [5],
          reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *u)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  char *extraout_RDX;
  string_view sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string_view local_30;
  reference_wrapper *local_20;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *u_local;
  char (*t_local) [5];
  less *this_local;
  
  local_20 = (reference_wrapper *)u;
  u_local = (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)t;
  t_local = (char (*) [5])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,*t);
  sVar2._M_str = extraout_RDX;
  sVar2._M_len = (size_t)local_40._M_str;
  local_30 = TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::ImplicitConvert((TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_40._M_len,sVar2);
  str = std::reference_wrapper::operator_cast_to_string_(local_20);
  sVar2 = TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::ImplicitConvert<void>(str);
  bVar1 = std::operator<(local_30,sVar2);
  return bVar1;
}

Assistant:

bool operator()(const T& t, const U& u) const {
      return ImplicitConvert(t) < ImplicitConvert(u);
    }